

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void colors_pref_load(char *title,wchar_t row)

{
  do_cmd_pref_file_hack(8);
  Term_xtra(L'\n',L'\0');
  Term_redraw_all();
  return;
}

Assistant:

static void colors_pref_load(const char *title, int row)
{
	/* Ask for and load a user pref file */
	do_cmd_pref_file_hack(8);
	
	/* XXX should probably be a cleaner way to tell UI about
	 * colour changes - how about doing this in the pref file
	 * loading code too? */
	Term_xtra(TERM_XTRA_REACT, 0);
	Term_redraw_all();
}